

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-options.c
# Opt level: O3

int udp_options_test(sockaddr *addr)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ushort *puVar8;
  undefined1 *puVar9;
  ulong uVar10;
  int iVar11;
  undefined1 *puVar12;
  undefined1 *puVar13;
  undefined1 *puVar14;
  undefined1 *puVar15;
  undefined1 *puVar16;
  undefined1 *puVar17;
  long lVar18;
  bool bVar19;
  uv_udp_t h;
  undefined1 auStack_2f8 [216];
  undefined1 auStack_220 [216];
  code *pcStack_148;
  int iStack_134;
  sockaddr asStack_130 [2];
  code *pcStack_110;
  undefined1 local_100 [216];
  
  pcStack_110 = (code *)0x17b903;
  uVar6 = uv_default_loop();
  pcStack_110 = (code *)0x17b913;
  iVar2 = uv_udp_init(uVar6,local_100);
  if (iVar2 != 0) goto LAB_0017baba;
  pcStack_110 = (code *)0x17b928;
  uv_unref(local_100);
  pcStack_110 = (code *)0x17b935;
  iVar2 = uv_udp_bind(local_100,addr,0);
  if (iVar2 != 0) goto LAB_0017babf;
  iVar11 = 1;
  pcStack_110 = (code *)0x17b954;
  iVar2 = uv_udp_set_broadcast(local_100,1);
  pcStack_110 = (code *)0x17b964;
  iVar3 = uv_udp_set_broadcast(local_100,1);
  pcStack_110 = (code *)0x17b974;
  iVar4 = uv_udp_set_broadcast(local_100,0);
  pcStack_110 = (code *)0x17b984;
  iVar5 = uv_udp_set_broadcast(local_100,0);
  if (iVar5 != 0 || (iVar4 != 0 || (iVar3 != 0 || iVar2 != 0))) goto LAB_0017bac4;
  do {
    pcStack_110 = (code *)0x17b99c;
    iVar2 = uv_udp_set_ttl(local_100,iVar11);
    if (iVar2 != 0) {
      pcStack_110 = (code *)0x17bab0;
      udp_options_test_cold_4();
      goto LAB_0017bab0;
    }
    iVar11 = iVar11 + 1;
  } while (iVar11 != 0x100);
  lVar18 = 0;
  do {
    pcStack_110 = (code *)0x17b9c9;
    iVar2 = uv_udp_set_ttl(local_100,*(undefined4 *)((long)udp_options_test::invalid_ttls + lVar18))
    ;
    if (iVar2 != -0x16) goto LAB_0017bab0;
    lVar18 = lVar18 + 4;
  } while (lVar18 != 0xc);
  pcStack_110 = (code *)0x17b9ee;
  iVar2 = uv_udp_set_multicast_loop(local_100,1);
  pcStack_110 = (code *)0x17b9fd;
  iVar3 = uv_udp_set_multicast_loop(local_100,1);
  iVar11 = 0;
  pcStack_110 = (code *)0x17ba0f;
  iVar4 = uv_udp_set_multicast_loop(local_100,0);
  pcStack_110 = (code *)0x17ba1f;
  iVar5 = uv_udp_set_multicast_loop(local_100,0);
  if (iVar5 != 0 || (iVar4 != 0 || (iVar3 != 0 || iVar2 != 0))) goto LAB_0017bac9;
  do {
    pcStack_110 = (code *)0x17ba37;
    iVar2 = uv_udp_set_multicast_ttl(local_100,iVar11);
    if (iVar2 != 0) goto LAB_0017bab5;
    iVar11 = iVar11 + 1;
  } while (iVar11 != 0x100);
  pcStack_110 = (code *)0x17ba54;
  iVar2 = uv_udp_set_multicast_ttl(local_100,0x100);
  if (iVar2 != -0x16) goto LAB_0017bace;
  pcStack_110 = (code *)0x17ba63;
  iVar2 = uv_run(uVar6,0);
  if (iVar2 != 0) goto LAB_0017bad3;
  pcStack_110 = (code *)0x17ba6c;
  uVar6 = uv_default_loop();
  pcStack_110 = (code *)0x17ba80;
  uv_walk(uVar6,close_walk_cb,0);
  pcStack_110 = (code *)0x17ba8a;
  uv_run(uVar6,0);
  pcStack_110 = (code *)0x17ba8f;
  uVar7 = uv_default_loop();
  pcStack_110 = (code *)0x17ba97;
  iVar2 = uv_loop_close(uVar7);
  if (iVar2 == 0) {
    return 0;
  }
  goto LAB_0017bad8;
LAB_0017bab0:
  pcStack_110 = (code *)0x17bab5;
  udp_options_test_cold_5();
LAB_0017bab5:
  pcStack_110 = (code *)0x17baba;
  udp_options_test_cold_7();
LAB_0017baba:
  pcStack_110 = (code *)0x17babf;
  udp_options_test_cold_1();
LAB_0017babf:
  pcStack_110 = (code *)0x17bac4;
  udp_options_test_cold_2();
LAB_0017bac4:
  pcStack_110 = (code *)0x17bac9;
  udp_options_test_cold_3();
LAB_0017bac9:
  pcStack_110 = (code *)0x17bace;
  udp_options_test_cold_6();
LAB_0017bace:
  pcStack_110 = (code *)0x17bad3;
  udp_options_test_cold_8();
LAB_0017bad3:
  pcStack_110 = (code *)0x17bad8;
  udp_options_test_cold_9();
LAB_0017bad8:
  pcStack_110 = run_test_udp_options6;
  udp_options_test_cold_10();
  pcStack_148 = (code *)0x17baf1;
  pcStack_110 = (code *)uVar6;
  iVar2 = uv_interface_addresses(asStack_130,&iStack_134);
  if (iVar2 != 0) {
LAB_0017bb62:
    pcStack_148 = (code *)0x17bb67;
    run_test_udp_options6_cold_1();
    return 1;
  }
  if ((long)iStack_134 < 1) {
    pcStack_148 = (code *)0x17bb62;
    uv_free_interface_addresses();
    goto LAB_0017bb62;
  }
  puVar8 = (ushort *)(asStack_130[0]._0_8_ + 0x14);
  uVar10 = 1;
  do {
    uVar1 = *puVar8;
    if (uVar1 == 10) break;
    puVar8 = puVar8 + 0x28;
    bVar19 = uVar10 < (ulong)(long)iStack_134;
    uVar10 = uVar10 + 1;
  } while (bVar19);
  pcStack_148 = (code *)0x17bb2b;
  uv_free_interface_addresses();
  if (uVar1 != 10) goto LAB_0017bb62;
  pcStack_148 = (code *)0x17bb47;
  iVar2 = uv_ip6_addr("::",0x23a3,asStack_130);
  if (iVar2 == 0) {
    pcStack_148 = (code *)0x17bb55;
    udp_options_test(asStack_130);
    return 0;
  }
  pcStack_148 = run_test_udp_no_autobind;
  run_test_udp_options6_cold_2();
  puVar13 = auStack_2f8;
  puVar16 = auStack_2f8;
  puVar14 = auStack_2f8;
  puVar17 = auStack_2f8;
  puVar15 = auStack_2f8;
  pcStack_148 = (code *)(ulong)uVar1;
  puVar9 = (undefined1 *)uv_default_loop();
  puVar12 = puVar9;
  iVar2 = uv_udp_init(puVar9,auStack_220);
  if (iVar2 == 0) {
    puVar12 = auStack_220;
    iVar2 = uv_udp_set_multicast_ttl(puVar12,0x20);
    if (iVar2 != -9) goto LAB_0017bd12;
    puVar12 = auStack_220;
    iVar2 = uv_udp_set_broadcast(puVar12,1);
    if (iVar2 != -9) goto LAB_0017bd17;
    puVar12 = auStack_220;
    iVar2 = uv_udp_set_ttl(puVar12,1);
    if (iVar2 != -9) goto LAB_0017bd1c;
    puVar12 = auStack_220;
    iVar2 = uv_udp_set_multicast_loop(puVar12,1);
    if (iVar2 != -9) goto LAB_0017bd21;
    puVar12 = auStack_220;
    iVar2 = uv_udp_set_multicast_interface(puVar12,"0.0.0.0");
    if (iVar2 != -9) goto LAB_0017bd26;
    uv_close(auStack_220,0);
    puVar12 = puVar9;
    iVar2 = uv_udp_init_ex(puVar9,auStack_2f8,2);
    if (iVar2 != 0) goto LAB_0017bd2b;
    iVar2 = uv_udp_set_multicast_ttl(auStack_2f8,0x20);
    puVar12 = puVar13;
    if (iVar2 != 0) goto LAB_0017bd30;
    iVar2 = uv_udp_set_broadcast(auStack_2f8,1);
    if (iVar2 != 0) goto LAB_0017bd35;
    iVar2 = uv_udp_set_ttl(auStack_2f8,1);
    puVar16 = puVar14;
    if (iVar2 != 0) goto LAB_0017bd3a;
    iVar2 = uv_udp_set_multicast_loop(auStack_2f8,1);
    if (iVar2 != 0) goto LAB_0017bd3f;
    iVar2 = uv_udp_set_multicast_interface(auStack_2f8,"0.0.0.0");
    puVar17 = puVar15;
    if (iVar2 != 0) goto LAB_0017bd44;
    uv_close(auStack_2f8,0);
    iVar2 = uv_run(puVar9,0);
    if (iVar2 == 0) {
      uVar6 = uv_default_loop();
      uv_walk(uVar6,close_walk_cb,0);
      uv_run(uVar6,0);
      puVar9 = (undefined1 *)uv_default_loop();
      iVar2 = uv_loop_close(puVar9);
      if (iVar2 == 0) {
        return 0;
      }
      goto LAB_0017bd4e;
    }
  }
  else {
    run_test_udp_no_autobind_cold_1();
LAB_0017bd12:
    run_test_udp_no_autobind_cold_2();
LAB_0017bd17:
    run_test_udp_no_autobind_cold_3();
LAB_0017bd1c:
    run_test_udp_no_autobind_cold_4();
LAB_0017bd21:
    run_test_udp_no_autobind_cold_5();
LAB_0017bd26:
    run_test_udp_no_autobind_cold_6();
LAB_0017bd2b:
    run_test_udp_no_autobind_cold_7();
LAB_0017bd30:
    puVar16 = puVar12;
    run_test_udp_no_autobind_cold_8();
LAB_0017bd35:
    run_test_udp_no_autobind_cold_9();
LAB_0017bd3a:
    puVar17 = puVar16;
    run_test_udp_no_autobind_cold_10();
LAB_0017bd3f:
    run_test_udp_no_autobind_cold_11();
LAB_0017bd44:
    puVar9 = puVar17;
    run_test_udp_no_autobind_cold_12();
  }
  run_test_udp_no_autobind_cold_13();
LAB_0017bd4e:
  run_test_udp_no_autobind_cold_14();
  iVar2 = uv_is_closing();
  if (iVar2 == 0) {
    iVar2 = uv_close(puVar9,0);
    return iVar2;
  }
  return iVar2;
}

Assistant:

static int udp_options_test(const struct sockaddr* addr) {
  static int invalid_ttls[] = { -1, 0, 256 };
  uv_loop_t* loop;
  uv_udp_t h;
  int i, r;

  loop = uv_default_loop();

  r = uv_udp_init(loop, &h);
  ASSERT(r == 0);

  uv_unref((uv_handle_t*)&h); /* don't keep the loop alive */

  r = uv_udp_bind(&h, addr, 0);
  ASSERT(r == 0);

  r = uv_udp_set_broadcast(&h, 1);
  r |= uv_udp_set_broadcast(&h, 1);
  r |= uv_udp_set_broadcast(&h, 0);
  r |= uv_udp_set_broadcast(&h, 0);
  ASSERT(r == 0);

  /* values 1-255 should work */
  for (i = 1; i <= 255; i++) {
    r = uv_udp_set_ttl(&h, i);
#if defined(__MVS__)
    if (addr->sa_family == AF_INET6)
      ASSERT(r == 0);
    else
      ASSERT(r == UV_ENOTSUP);
#else
    ASSERT(r == 0);
#endif
  }

  for (i = 0; i < (int) ARRAY_SIZE(invalid_ttls); i++) {
    r = uv_udp_set_ttl(&h, invalid_ttls[i]);
    ASSERT(r == UV_EINVAL);
  }

  r = uv_udp_set_multicast_loop(&h, 1);
  r |= uv_udp_set_multicast_loop(&h, 1);
  r |= uv_udp_set_multicast_loop(&h, 0);
  r |= uv_udp_set_multicast_loop(&h, 0);
  ASSERT(r == 0);

  /* values 0-255 should work */
  for (i = 0; i <= 255; i++) {
    r = uv_udp_set_multicast_ttl(&h, i);
    ASSERT(r == 0);
  }

  /* anything >255 should fail */
  r = uv_udp_set_multicast_ttl(&h, 256);
  ASSERT(r == UV_EINVAL);
  /* don't test ttl=-1, it's a valid value on some platforms */

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}